

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

void __thiscall cppjieba::DictTrie::SetStaticWordWeights(DictTrie *this,UserWordWeightOption option)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined8 __first;
  undefined8 __last;
  ulong uVar4;
  DictUnit *pDVar5;
  double dVar6;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> x;
  undefined1 local_1a0 [384];
  
  if ((this->static_node_infos_).
      super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->static_node_infos_).
      super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    limonp::Logger::Logger
              ((Logger *)local_1a0,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
               ,0xe0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"exp: [!static_node_infos_.empty()",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"] false. ",9);
    limonp::Logger::~Logger((Logger *)local_1a0);
  }
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::vector
            ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)local_1a0,
             &this->static_node_infos_);
  __last = local_1a0._8_8_;
  __first = local_1a0._0_8_;
  pDVar5 = (DictUnit *)local_1a0._0_8_;
  if (local_1a0._0_8_ != local_1a0._8_8_) {
    uVar4 = (long)(local_1a0._8_8_ - local_1a0._0_8_) >> 7;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cppjieba::DictUnit_const&,cppjieba::DictUnit_const&)>>
              ((__normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
                )local_1a0._0_8_,
               (__normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
                )local_1a0._8_8_,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_cppjieba::DictUnit_&,_const_cppjieba::DictUnit_&)>)
               WeightCompare);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cppjieba::DictUnit_const&,cppjieba::DictUnit_const&)>>
              ((__normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
                )__first,
               (__normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
                )__last,(_Iter_comp_iter<bool_(*)(const_cppjieba::DictUnit_&,_const_cppjieba::DictUnit_&)>
                         )WeightCompare);
    pDVar5 = (DictUnit *)local_1a0._8_8_;
  }
  dVar6 = ((DictUnit *)local_1a0._0_8_)->weight;
  this->min_weight_ = dVar6;
  dVar1 = pDVar5[-1].weight;
  this->max_weight_ = dVar1;
  dVar2 = *(double *)
           ((long)(&((DictUnit *)local_1a0._0_8_)->word + 1) +
           ((long)pDVar5 - local_1a0._0_8_ >> 1 & 0xffffffffffffff80U));
  this->median_weight_ = dVar2;
  if ((option != WordWeightMin) && (dVar6 = dVar2, option != WordWeightMedian)) {
    dVar6 = dVar1;
  }
  this->user_word_default_weight_ = dVar6;
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::~vector
            ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)local_1a0);
  return;
}

Assistant:

void SetStaticWordWeights(UserWordWeightOption option) {
    XCHECK(!static_node_infos_.empty());
    vector<DictUnit> x = static_node_infos_;
    sort(x.begin(), x.end(), WeightCompare);
    min_weight_ = x[0].weight;
    max_weight_ = x[x.size() - 1].weight;
    median_weight_ = x[x.size() / 2].weight;
    switch (option) {
     case WordWeightMin:
       user_word_default_weight_ = min_weight_;
       break;
     case WordWeightMedian:
       user_word_default_weight_ = median_weight_;
       break;
     default:
       user_word_default_weight_ = max_weight_;
       break;
    }
  }